

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall ParserTestDyndepExplicitInput::Run(ParserTestDyndepExplicitInput *this)

{
  Test *pTVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  Node *this_00;
  string *__lhs;
  StringPiece local_30;
  Edge *local_20;
  Edge *edge;
  ParserTestDyndepExplicitInput *pPStack_10;
  int fail_count;
  ParserTestDyndepExplicitInput *this_local;
  
  pPStack_10 = this;
  edge._4_4_ = testing::Test::AssertionFailures(g_current_test);
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "rule cat\n  command = cat $in > $out\nbuild result: cat in\n  dyndep = in\n");
  iVar2 = edge._4_4_;
  iVar4 = testing::Test::AssertionFailures(g_current_test);
  if (iVar2 == iVar4) {
    StringPiece::StringPiece(&local_30,"result");
    this_00 = State::GetNode(&(this->super_ParserTest).state,local_30,
                             &(this->super_ParserTest).state.bindings_,0);
    local_20 = Node::in_edge(this_00);
    bVar3 = testing::Test::Check
                      (g_current_test,local_20->dyndep_ != (Node *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/manifest_parser_test.cc"
                       ,0x475,"edge->dyndep_");
    pTVar1 = g_current_test;
    if (bVar3) {
      bVar3 = Node::dyndep_pending(local_20->dyndep_);
      testing::Test::Check
                (pTVar1,bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/manifest_parser_test.cc"
                 ,0x476,"edge->dyndep_->dyndep_pending()");
      pTVar1 = g_current_test;
      __lhs = Node::path_abi_cxx11_(local_20->dyndep_);
      bVar3 = std::operator==(__lhs,"in");
      testing::Test::Check
                (pTVar1,bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ndsol[P]subninja/src/manifest_parser_test.cc"
                 ,0x477,"edge->dyndep_->path() == \"in\"");
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(ParserTest, DyndepExplicitInput) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat\n"
"  command = cat $in > $out\n"
"build result: cat in\n"
"  dyndep = in\n"));
  Edge* edge = state.GetNode("result", &state.bindings_, 0)->in_edge();
  ASSERT_TRUE(edge->dyndep_);
  EXPECT_TRUE(edge->dyndep_->dyndep_pending());
  EXPECT_EQ(edge->dyndep_->path(), "in");
}